

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O3

bool IntToBoundedCast(Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar6;
  undefined8 uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  ulong uVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  int32_t *dataptr;
  void *pvVar12;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t extraout_RDX_01;
  idx_t extraout_RDX_02;
  idx_t iVar13;
  idx_t extraout_RDX_03;
  idx_t idx;
  idx_t extraout_RDX_04;
  idx_t extraout_RDX_05;
  ulong uVar14;
  ulong uVar15;
  idx_t iVar16;
  VectorType VVar17;
  idx_t idx_in_entry;
  long lVar18;
  ulong uVar19;
  int32_t output_max_val;
  int32_t *local_d0;
  long local_c8;
  long local_c0;
  Vector *local_b8;
  void *local_b0;
  undefined8 local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  void *local_98;
  long local_90;
  unsigned_long local_88;
  int32_t local_7c;
  long *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_7c = BoundedType::GetMaxValue((LogicalType *)(result + 8));
  dataptr = &local_7c;
  VVar17 = (VectorType)result;
  local_d0 = dataptr;
  if (*source == (Vector)0x0) {
    duckdb::Vector::SetVectorType(VVar17);
    lVar18 = *(long *)(result + 0x20);
    lVar4 = *(long *)(source + 0x20);
    duckdb::FlatVector::VerifyFlatVector(source);
    duckdb::FlatVector::VerifyFlatVector(result);
    if (*(long *)(source + 0x28) == 0) {
      if (count != 0) {
        iVar16 = 0;
        iVar13 = extraout_RDX;
        do {
          iVar1 = *(int *)(lVar4 + iVar16 * 4);
          duckdb::UnaryLambdaWrapper::
          Operation<IntToBoundedCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                    (iVar1,(ValidityMask *)&local_d0,iVar13,dataptr);
          *(int *)(lVar18 + iVar16 * 4) = iVar1;
          iVar16 = iVar16 + 1;
          iVar13 = extraout_RDX_04;
        } while (count != iVar16);
      }
    }
    else {
      *(long *)(result + 0x28) = *(long *)(source + 0x28);
      duckdb::shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30),
                 (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(source + 0x30));
      *(undefined8 *)(result + 0x40) = *(undefined8 *)(source + 0x40);
      if (0x3f < count + 0x3f) {
        local_b0 = (void *)(count + 0x3f >> 6);
        pvVar12 = (void *)0x0;
        iVar13 = extraout_RDX_00;
        uVar19 = 0;
        local_c8 = lVar18;
        local_b8 = source;
        do {
          local_98 = pvVar12;
          if (*(long *)(source + 0x28) == 0) {
            uVar9 = uVar19 + 0x40;
            if (count <= uVar19 + 0x40) {
              uVar9 = count;
            }
LAB_00116500:
            uVar15 = uVar19;
            if (uVar19 < uVar9) {
              do {
                iVar1 = *(int *)(lVar4 + uVar19 * 4);
                duckdb::UnaryLambdaWrapper::
                Operation<IntToBoundedCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                          (iVar1,(ValidityMask *)&local_d0,iVar13,pvVar12);
                *(int *)(lVar18 + uVar19 * 4) = iVar1;
                uVar19 = uVar19 + 1;
                iVar13 = extraout_RDX_01;
                uVar15 = uVar9;
              } while (uVar9 != uVar19);
            }
          }
          else {
            uVar5 = *(ulong *)(*(long *)(source + 0x28) + (long)pvVar12 * 8);
            uVar9 = uVar19 + 0x40;
            if (count <= uVar19 + 0x40) {
              uVar9 = count;
            }
            uVar15 = uVar9;
            lVar18 = local_c8;
            if (uVar5 != 0) {
              if (uVar5 == 0xffffffffffffffff) goto LAB_00116500;
              uVar15 = uVar19;
              source = local_b8;
              if (uVar19 < uVar9) {
                local_c0 = local_c8 + uVar19 * 4;
                local_90 = uVar19 * 4 + lVar4;
                uVar14 = 0;
                do {
                  if ((uVar5 >> (uVar14 & 0x3f) & 1) != 0) {
                    iVar1 = *(int *)(local_90 + uVar14 * 4);
                    duckdb::UnaryLambdaWrapper::
                    Operation<IntToBoundedCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                              (iVar1,(ValidityMask *)&local_d0,iVar13,pvVar12);
                    *(int *)(local_c0 + uVar14 * 4) = iVar1;
                    iVar13 = extraout_RDX_02;
                  }
                  uVar14 = uVar14 + 1;
                  uVar15 = uVar9;
                  lVar18 = local_c8;
                  source = local_b8;
                } while (uVar9 - uVar19 != uVar14);
              }
            }
          }
          pvVar12 = (void *)((long)local_98 + 1);
          uVar19 = uVar15;
        } while (pvVar12 != local_b0);
      }
    }
  }
  else if (*source == (Vector)0x2) {
    duckdb::Vector::SetVectorType(VVar17);
    piVar2 = *(int **)(result + 0x20);
    piVar3 = *(int **)(source + 0x20);
    if ((*(byte **)(source + 0x28) == (byte *)0x0) || ((**(byte **)(source + 0x28) & 1) != 0)) {
      duckdb::ConstantVector::SetNull(result,false);
      iVar1 = *piVar3;
      duckdb::UnaryLambdaWrapper::
      Operation<IntToBoundedCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                (iVar1,(ValidityMask *)&local_d0,idx,dataptr);
      *piVar2 = iVar1;
    }
    else {
      duckdb::ConstantVector::SetNull(result,true);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)source,(UnifiedVectorFormat *)count);
    duckdb::Vector::SetVectorType(VVar17);
    local_c0 = *(long *)(result + 0x20);
    duckdb::FlatVector::VerifyFlatVector(result);
    if (local_68 == 0) {
      if (count != 0) {
        lVar18 = *local_78;
        uVar19 = 0;
        iVar13 = extraout_RDX_03;
        do {
          uVar9 = uVar19;
          if (lVar18 != 0) {
            uVar9 = (ulong)*(uint *)(lVar18 + uVar19 * 4);
          }
          iVar1 = *(int *)(local_70 + uVar9 * 4);
          duckdb::UnaryLambdaWrapper::
          Operation<IntToBoundedCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                    (iVar1,(ValidityMask *)&local_d0,iVar13,dataptr);
          *(int *)(local_c0 + uVar19 * 4) = iVar1;
          uVar19 = uVar19 + 1;
          iVar13 = extraout_RDX_05;
        } while (count != uVar19);
      }
    }
    else if (count != 0) {
      lVar18 = *local_78;
      uVar19 = 0;
      do {
        uVar9 = uVar19;
        if (lVar18 != 0) {
          uVar9 = (ulong)*(uint *)(lVar18 + uVar19 * 4);
        }
        pvVar12 = *(void **)(local_68 + (uVar9 >> 6) * 8);
        if (((ulong)pvVar12 >> (uVar9 & 0x3f) & 1) == 0) {
          _Var11._M_head_impl = *(unsigned_long **)(result + 0x28);
          if (_Var11._M_head_impl == (unsigned_long *)0x0) {
            local_88 = *(unsigned_long *)(result + 0x40);
            duckdb::make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,&local_88);
            p_Var8 = p_Stack_a0;
            uVar7 = local_a8;
            local_a8 = 0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
            *(undefined8 *)(result + 0x30) = uVar7;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var8;
            if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
               p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar10 = duckdb::shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                      operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (result + 0x30));
            _Var11._M_head_impl =
                 (pTVar10->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            *(unsigned_long **)(result + 0x28) = _Var11._M_head_impl;
          }
          bVar6 = (byte)uVar19 & 0x3f;
          _Var11._M_head_impl[uVar19 >> 6] =
               _Var11._M_head_impl[uVar19 >> 6] &
               (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
        }
        else {
          iVar1 = *(int *)(local_70 + uVar9 * 4);
          duckdb::UnaryLambdaWrapper::
          Operation<IntToBoundedCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                    (iVar1,(ValidityMask *)&local_d0,uVar9 >> 6,pvVar12);
          *(int *)(local_c0 + uVar19 * 4) = iVar1;
        }
        uVar19 = uVar19 + 1;
      } while (count != uVar19);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return true;
}

Assistant:

static bool IntToBoundedCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &ty = result.GetType();
	auto output_max_val = BoundedType::GetMaxValue(ty);
	UnaryExecutor::Execute<int32_t, int32_t>(source, result, count, [&](int32_t input) {
		if (input > output_max_val) {
			throw ConversionException(StringUtil::Format("Value %s exceeds max value of bounded type (%s)",
			                                             to_string(input), to_string(output_max_val)));
		}
		return input;
	});
	return true;
}